

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack21_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x15;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3ff) << 0xb | *puVar1;
  out[2] = *puVar2 >> 10 & 0x1fffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[2] & 0xfffff) << 1 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[2] >> 0x14;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0x1ff) << 0xc | *puVar1;
  out[5] = *puVar2 >> 9 & 0x1fffff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[4] & 0x7ffff) << 2 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[4] >> 0x13;
  *puVar1 = (in[5] & 0xff) << 0xd | *puVar1;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack21_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;

  return in + 1;
}